

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase414::run(TestCase414 *this)

{
  FsNode *pFVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  EVP_PKEY_CTX *pEVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar7;
  char *ptrCopy;
  char *pcVar8;
  char *__s1;
  char *pcVar9;
  bool bVar10;
  StringPtr text;
  StringPtr text_00;
  Own<kj::File,_std::nullptr_t> dest;
  String bigString;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Own<kj::File,_std::nullptr_t> source;
  TestClock clock;
  undefined8 *local_d8;
  FsNode *local_d0;
  String local_c8;
  String local_a8;
  undefined1 local_88 [32];
  char *local_68;
  bool local_60;
  bool local_58;
  undefined8 *local_50;
  EVP_PKEY_CTX *local_48;
  TestClock local_40;
  
  local_40.super_Clock._vptr_Clock = (_func_int **)&PTR_now_006363b8;
  local_40.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  newInMemoryFile((kj *)&local_50,&local_40.super_Clock);
  text.content.size_ = 10;
  text.content.ptr = "foobarbaz";
  File::writeAll((File *)local_48,text);
  newInMemoryFile((kj *)&local_d8,&local_40.super_Clock);
  text_00.content.size_ = 9;
  text_00.content.ptr = "quxcorge";
  File::writeAll((File *)local_d0,text_00);
  TestClock::expectChanged(&local_40,local_d0);
  iVar6 = File::copy((File *)local_d0,(EVP_PKEY_CTX *)0x3,local_48);
  local_88._0_8_ = CONCAT44(extraout_var,iVar6);
  local_88._8_4_ = 3;
  local_88._16_8_ = " == ";
  local_88._24_8_ = &DAT_00000005;
  local_68 = (char *)CONCAT71(local_68._1_7_,(char *)local_88._0_8_ == (char *)0x3);
  if (((char *)local_88._0_8_ != (char *)0x3) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[68],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1a8,ERROR,
               "\"failed: expected \" \"dest->File::copy(3, *source, 6, kj::maxValue) == 3\", _kjCondition"
               ,(char (*) [68])"failed: expected dest->File::copy(3, *source, 6, kj::maxValue) == 3"
               ,(DebugComparison<unsigned_long,_int> *)local_88);
  }
  TestClock::expectChanged(&local_40,local_d0);
  ReadableFile::readAllText(&local_a8,(ReadableFile *)local_d0);
  local_c8.content.ptr = local_a8.content.ptr;
  local_c8.content.size_ = local_a8.content.size_;
  local_c8.content.disposer = local_a8.content.disposer;
  local_a8.content.ptr = (char *)0x0;
  local_a8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[9]> *)local_88,
             (DebugExpression<kj::String> *)&local_c8,(char (*) [9])"quxbazge");
  sVar2 = local_c8.content.size_;
  pcVar7 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  sVar2 = local_a8.content.size_;
  pcVar7 = local_a8.content.ptr;
  if (local_a8.content.ptr != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  if ((local_58 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1aa,ERROR,
               "\"failed: expected \" \"dest->readAllText() == \\\"quxbazge\\\"\", _kjCondition",
               (char (*) [51])"failed: expected dest->readAllText() == \"quxbazge\"",
               (DebugComparison<kj::String,_const_char_(&)[9]> *)local_88);
  }
  uVar4 = local_88._8_8_;
  uVar3 = local_88._0_8_;
  if ((char *)local_88._0_8_ != (char *)0x0) {
    local_88._0_8_ = (char *)0x0;
    local_88._8_8_ = 0;
    (**(_func_int **)((Array<char> *)local_88._16_8_)->ptr)(local_88._16_8_,uVar3,1,uVar4,uVar4,0);
  }
  iVar6 = File::copy((File *)local_d0,(EVP_PKEY_CTX *)0x0,local_48);
  local_88._0_8_ = CONCAT44(extraout_var_00,iVar6);
  local_88._8_4_ = 4;
  local_88._16_8_ = " == ";
  local_88._24_8_ = &DAT_00000005;
  local_68 = (char *)CONCAT71(local_68._1_7_,(undefined1 *)local_88._0_8_ == &DAT_00000004);
  if (((undefined1 *)local_88._0_8_ != &DAT_00000004) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1ac,ERROR,
               "\"failed: expected \" \"dest->File::copy(0, *source, 3, 4) == 4\", _kjCondition",
               (char (*) [57])"failed: expected dest->File::copy(0, *source, 3, 4) == 4",
               (DebugComparison<unsigned_long,_int> *)local_88);
  }
  TestClock::expectChanged(&local_40,local_d0);
  ReadableFile::readAllText(&local_a8,(ReadableFile *)local_d0);
  local_c8.content.ptr = local_a8.content.ptr;
  local_c8.content.size_ = local_a8.content.size_;
  local_c8.content.disposer = local_a8.content.disposer;
  local_a8.content.ptr = (char *)0x0;
  local_a8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[9]> *)local_88,
             (DebugExpression<kj::String> *)&local_c8,(char (*) [9])"barbazge");
  sVar2 = local_c8.content.size_;
  pcVar7 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  sVar2 = local_a8.content.size_;
  pcVar7 = local_a8.content.ptr;
  if (local_a8.content.ptr != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  if ((local_58 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1ae,ERROR,
               "\"failed: expected \" \"dest->readAllText() == \\\"barbazge\\\"\", _kjCondition",
               (char (*) [51])"failed: expected dest->readAllText() == \"barbazge\"",
               (DebugComparison<kj::String,_const_char_(&)[9]> *)local_88);
  }
  uVar4 = local_88._8_8_;
  uVar3 = local_88._0_8_;
  if ((char *)local_88._0_8_ != (char *)0x0) {
    local_88._0_8_ = (char *)0x0;
    local_88._8_8_ = 0;
    (**(_func_int **)((Array<char> *)local_88._16_8_)->ptr)(local_88._16_8_,uVar3,1,uVar4,uVar4,0);
  }
  iVar6 = File::copy((File *)local_d0,(EVP_PKEY_CTX *)0x0,local_48);
  local_88._0_8_ = CONCAT44(extraout_var_01,iVar6);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_88._16_8_ = " == ";
  local_88._24_8_ = &DAT_00000005;
  bVar10 = (char *)local_88._0_8_ == (char *)0x0;
  local_68._0_1_ = bVar10;
  if ((!bVar10) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[70],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1b0,ERROR,
               "\"failed: expected \" \"dest->File::copy(0, *source, 128, kj::maxValue) == 0\", _kjCondition"
               ,(char (*) [70])
                "failed: expected dest->File::copy(0, *source, 128, kj::maxValue) == 0",
               (DebugComparison<unsigned_long,_int> *)local_88);
  }
  TestClock::expectUnchanged(&local_40,local_d0);
  pcVar7 = (char *)0x3;
  iVar6 = File::copy((File *)local_d0,(EVP_PKEY_CTX *)&DAT_00000004,local_48);
  local_88._0_8_ = CONCAT44(extraout_var_02,iVar6);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_88._16_8_ = " == ";
  local_88._24_8_ = &DAT_00000005;
  local_68 = (char *)CONCAT71(local_68._1_7_,(char *)local_88._0_8_ == (char *)0x0);
  if (((char *)local_88._0_8_ != (char *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    pcVar7 = "\"failed: expected \" \"dest->File::copy(4, *source, 3, 0) == 0\", _kjCondition";
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1b3,ERROR,
               "\"failed: expected \" \"dest->File::copy(4, *source, 3, 0) == 0\", _kjCondition",
               (char (*) [57])"failed: expected dest->File::copy(4, *source, 3, 0) == 0",
               (DebugComparison<unsigned_long,_int> *)local_88);
  }
  TestClock::expectUnchanged(&local_40,local_d0);
  local_88._0_8_ = "foobar";
  local_88._8_8_ = 10000;
  strArray<kj::Repeat<char_const*>>
            (&local_c8,(kj *)local_88,(Repeat<const_char_*> *)0x4d2b65,pcVar7);
  pcVar7 = (char *)0x0;
  if ((char *)local_c8.content.size_ != (char *)0x0) {
    pcVar7 = (char *)(local_c8.content.size_ + -1);
  }
  (**(code **)(*(long *)local_48 + 0x58))(local_48,pcVar7 + 1000);
  pcVar7 = (char *)local_c8.content.size_;
  if ((char *)local_c8.content.size_ != (char *)0x0) {
    pcVar7 = local_c8.content.ptr;
  }
  pcVar8 = (char *)0x0;
  if ((char *)local_c8.content.size_ != (char *)0x0) {
    pcVar8 = (char *)(local_c8.content.size_ + -1);
  }
  (**(code **)(*(long *)local_48 + 0x48))(local_48,0x7b,pcVar7,pcVar8);
  File::copy((File *)local_d0,(EVP_PKEY_CTX *)0x141,local_48);
  ReadableFile::readAllText(&local_a8,(ReadableFile *)local_d0);
  sVar2 = local_a8.content.size_;
  pcVar7 = local_a8.content.ptr;
  pcVar8 = local_a8.content.ptr;
  if (local_a8.content.size_ == 0) {
    pcVar8 = "";
  }
  pcVar9 = (char *)((local_a8.content.size_ - 0x141) + (ulong)(local_a8.content.size_ == 0));
  pcVar8 = pcVar8 + 0x141;
  if ((char *)(local_c8.content.size_ + ((char *)local_c8.content.size_ == (char *)0x0)) == pcVar9)
  {
    __s1 = "";
    if ((char *)local_c8.content.size_ != (char *)0x0) {
      __s1 = local_c8.content.ptr;
    }
    iVar6 = bcmp(__s1,pcVar8,
                 (size_t)(local_c8.content.size_ + ((char *)local_c8.content.size_ == (char *)0x0)))
    ;
    local_60 = iVar6 == 0;
  }
  else {
    local_60 = false;
  }
  local_88._24_8_ = " == ";
  local_68 = &DAT_00000005;
  local_88._0_8_ = pcVar8;
  local_88._8_8_ = pcVar9;
  local_88._16_8_ = &local_c8;
  if (pcVar7 != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  if ((local_60 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::StringPtr,kj::String&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1bb,ERROR,
               "\"failed: expected \" \"dest->readAllText().slice(321) == bigString\", _kjCondition"
               ,(char (*) [61])"failed: expected dest->readAllText().slice(321) == bigString",
               (DebugComparison<kj::StringPtr,_kj::String_&> *)local_88);
  }
  sVar2 = local_c8.content.size_;
  pcVar7 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  pFVar1 = local_d0;
  if (local_d0 != (FsNode *)0x0) {
    local_d0 = (FsNode *)0x0;
    (**(code **)*local_d8)(local_d8,pFVar1->_vptr_FsNode[-2] + (long)&pFVar1->_vptr_FsNode);
  }
  pEVar5 = local_48;
  if (local_48 != (EVP_PKEY_CTX *)0x0) {
    local_48 = (EVP_PKEY_CTX *)0x0;
    (**(code **)*local_50)(local_50,pEVar5 + *(long *)(*(long *)pEVar5 + -0x10));
  }
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }